

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vint4_sse2.h
# Opt level: O1

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::ObjectIntersectorK<4,_false>_>,_false>
     ::occludedCoherent(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  ulong uVar1;
  float *pfVar2;
  AccelData *pAVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined4 in_EAX;
  uint uVar19;
  undefined4 uVar20;
  int iVar21;
  ulong uVar22;
  RTCIntersectFunctionN p_Var23;
  ulong uVar24;
  StackItemMaskT<embree::NodeRefPtr<4>_> *pSVar25;
  StackItemMaskT<embree::NodeRefPtr<4>_> *pSVar26;
  ulong uVar27;
  ulong uVar28;
  size_t sVar29;
  size_t sVar30;
  ulong uVar31;
  size_t sVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  bool bVar36;
  uint uVar70;
  float fVar71;
  vint4 bi_2;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  uint uVar72;
  float fVar73;
  uint uVar74;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar75;
  uint uVar76;
  uint uVar77;
  float fVar86;
  float fVar89;
  vint4 ai;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  uint uVar87;
  uint uVar88;
  float fVar90;
  uint uVar91;
  uint uVar92;
  float fVar93;
  uint uVar94;
  uint uVar95;
  float fVar96;
  undefined1 auVar85 [16];
  uint uVar97;
  float fVar98;
  uint uVar99;
  float fVar100;
  uint uVar101;
  float fVar102;
  vint4 ai_1;
  uint uVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  vint4 ai_3;
  float fVar115;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar116;
  float fVar117;
  float fVar124;
  float fVar125;
  vint4 ai_5;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar130;
  float fVar131;
  float fVar132;
  vint4 bi_4;
  undefined1 auVar129 [16];
  float fVar137;
  vint4 bi_3;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  vint4 ai_4;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  vint<4> octant;
  undefined1 local_11f8 [16];
  int local_11c8;
  int iStack_11c4;
  int iStack_11c0;
  int iStack_11bc;
  vint4 bi_9;
  undefined1 local_1158 [16];
  RTCIntersectFunctionNArguments local_1140;
  Geometry *local_1110;
  undefined8 local_1108;
  RTCIntersectArguments *local_1100;
  int local_10f8;
  int iStack_10f4;
  int iStack_10f0;
  int iStack_10ec;
  undefined1 local_10e8 [16];
  float local_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  undefined1 local_1078 [16];
  uint local_1068;
  uint uStack_1064;
  uint uStack_1060;
  uint uStack_105c;
  undefined1 local_1058 [16];
  undefined1 local_1048 [8];
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  undefined1 local_1028 [8];
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [16];
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  vint<4> mask;
  StackItemMaskT<embree::NodeRefPtr<4>_> stack [244];
  
  auVar78._0_4_ = -(uint)((valid_i->field_0).i[0] == -1);
  auVar78._4_4_ = -(uint)((valid_i->field_0).i[1] == -1);
  auVar78._8_4_ = -(uint)((valid_i->field_0).i[2] == -1);
  auVar78._12_4_ = -(uint)((valid_i->field_0).i[3] == -1);
  uVar19 = movmskps(in_EAX,auVar78);
  if (uVar19 == 0) {
    return;
  }
  local_10f8 = (valid_i->field_0).i[0];
  iStack_10f4 = (valid_i->field_0).i[1];
  iStack_10f0 = (valid_i->field_0).i[2];
  iStack_10ec = (valid_i->field_0).i[3];
  pAVar3 = This->ptr;
  uVar27 = (ulong)(uVar19 & 0xff);
  fVar141 = *(float *)ray;
  fVar142 = *(float *)(ray + 4);
  fVar143 = *(float *)(ray + 8);
  fVar144 = *(float *)(ray + 0xc);
  fVar145 = *(float *)(ray + 0x10);
  fVar146 = *(float *)(ray + 0x14);
  fVar147 = *(float *)(ray + 0x18);
  fVar148 = *(float *)(ray + 0x1c);
  auVar135 = *(undefined1 (*) [16])(ray + 0x40);
  fVar105 = (float)DAT_01ff1d40;
  fVar111 = DAT_01ff1d40._4_4_;
  fVar113 = DAT_01ff1d40._8_4_;
  fVar115 = DAT_01ff1d40._12_4_;
  auVar37._4_4_ = -(uint)(ABS(auVar135._4_4_) < fVar111);
  auVar37._0_4_ = -(uint)(ABS(auVar135._0_4_) < fVar105);
  auVar37._8_4_ = -(uint)(ABS(auVar135._8_4_) < fVar113);
  auVar37._12_4_ = -(uint)(ABS(auVar135._12_4_) < fVar115);
  auVar118 = blendvps(auVar135,_DAT_01ff1d40,auVar37);
  fVar149 = *(float *)(ray + 0x20);
  fVar150 = *(float *)(ray + 0x24);
  fVar151 = *(float *)(ray + 0x28);
  fVar152 = *(float *)(ray + 0x2c);
  auVar37 = *(undefined1 (*) [16])(ray + 0x50);
  auVar129._4_4_ = -(uint)(ABS(auVar37._4_4_) < fVar111);
  auVar129._0_4_ = -(uint)(ABS(auVar37._0_4_) < fVar105);
  auVar129._8_4_ = -(uint)(ABS(auVar37._8_4_) < fVar113);
  auVar129._12_4_ = -(uint)(ABS(auVar37._12_4_) < fVar115);
  auVar129 = blendvps(auVar37,_DAT_01ff1d40,auVar129);
  auVar37 = *(undefined1 (*) [16])(ray + 0x60);
  auVar119._4_4_ = -(uint)(ABS(auVar37._4_4_) < fVar111);
  auVar119._0_4_ = -(uint)(ABS(auVar37._0_4_) < fVar105);
  auVar119._8_4_ = -(uint)(ABS(auVar37._8_4_) < fVar113);
  auVar119._12_4_ = -(uint)(ABS(auVar37._12_4_) < fVar115);
  auVar133 = blendvps(auVar37,_DAT_01ff1d40,auVar119);
  auVar37 = rcpps(auVar119,auVar118);
  fVar153 = auVar37._0_4_;
  fVar154 = auVar37._4_4_;
  fVar155 = auVar37._8_4_;
  fVar156 = auVar37._12_4_;
  fVar153 = (1.0 - auVar118._0_4_ * fVar153) * fVar153 + fVar153;
  fVar154 = (1.0 - auVar118._4_4_ * fVar154) * fVar154 + fVar154;
  fVar155 = (1.0 - auVar118._8_4_ * fVar155) * fVar155 + fVar155;
  fVar156 = (1.0 - auVar118._12_4_ * fVar156) * fVar156 + fVar156;
  auVar37 = rcpps(auVar37,auVar129);
  fVar157 = auVar37._0_4_;
  fVar158 = auVar37._4_4_;
  fVar159 = auVar37._8_4_;
  fVar160 = auVar37._12_4_;
  fVar157 = (1.0 - auVar129._0_4_ * fVar157) * fVar157 + fVar157;
  fVar158 = (1.0 - auVar129._4_4_ * fVar158) * fVar158 + fVar158;
  fVar159 = (1.0 - auVar129._8_4_ * fVar159) * fVar159 + fVar159;
  fVar160 = (1.0 - auVar129._12_4_ * fVar160) * fVar160 + fVar160;
  auVar37 = rcpps(auVar37,auVar133);
  fVar105 = auVar37._0_4_;
  fVar111 = auVar37._4_4_;
  fVar113 = auVar37._8_4_;
  fVar115 = auVar37._12_4_;
  fVar105 = (1.0 - auVar133._0_4_ * fVar105) * fVar105 + fVar105;
  fVar111 = (1.0 - auVar133._4_4_ * fVar111) * fVar111 + fVar111;
  fVar113 = (1.0 - auVar133._8_4_ * fVar113) * fVar113 + fVar113;
  fVar115 = (1.0 - auVar133._12_4_ * fVar115) * fVar115 + fVar115;
  auVar107._0_12_ = ZEXT812(0);
  auVar107._12_4_ = 0;
  auVar37 = maxps(*(undefined1 (*) [16])(ray + 0x30),auVar107);
  local_10e8 = maxps(*(undefined1 (*) [16])(ray + 0x80),auVar107);
  auVar139._0_8_ =
       CONCAT44(-(uint)(auVar135._4_4_ < 0.0),-(uint)(auVar135._0_4_ < 0.0)) & 0x100000001;
  auVar139._8_4_ = -(uint)(auVar135._8_4_ < 0.0) & 1;
  auVar139._12_4_ = -(uint)(auVar135._12_4_ < 0.0) & 1;
  auVar135._8_4_ = 0xffffffff;
  auVar135._0_8_ = 0xffffffffffffffff;
  auVar135._12_4_ = 0xffffffff;
  local_1078 = auVar78 ^ auVar135;
  auVar118._0_8_ =
       CONCAT44(-(uint)(*(float *)(ray + 0x54) < 0.0),-(uint)(*(float *)(ray + 0x50) < 0.0)) &
       0x200000002;
  auVar118._8_4_ = -(uint)(*(float *)(ray + 0x58) < 0.0) & 2;
  auVar118._12_4_ = -(uint)(*(float *)(ray + 0x5c) < 0.0) & 2;
  auVar133._0_8_ =
       CONCAT44(-(uint)(*(float *)(ray + 100) < 0.0),-(uint)(*(float *)(ray + 0x60) < 0.0)) &
       0x400000004;
  auVar133._8_4_ = -(uint)(*(float *)(ray + 0x68) < 0.0) & 4;
  auVar133._12_4_ = -(uint)(*(float *)(ray + 0x6c) < 0.0) & 4;
  local_1158 = auVar133 | local_1078 | auVar118 | auVar139;
  _local_1068 = mm_lookupmask_ps._0_8_;
  _uStack_1060 = mm_lookupmask_ps._8_8_;
  local_1088 = fVar141;
  fStack_1084 = fVar142;
  fStack_1080 = fVar143;
  fStack_107c = fVar144;
  local_1098 = fVar145;
  fStack_1094 = fVar146;
  fStack_1090 = fVar147;
  fStack_108c = fVar148;
  local_10a8 = fVar149;
  fStack_10a4 = fVar150;
  fStack_10a0 = fVar151;
  fStack_109c = fVar152;
  local_10b8 = fVar105;
  fStack_10b4 = fVar111;
  fStack_10b0 = fVar113;
  fStack_10ac = fVar115;
  local_10c8 = fVar153;
  fStack_10c4 = fVar154;
  fStack_10c0 = fVar155;
  fStack_10bc = fVar156;
  local_10d8 = fVar157;
  fStack_10d4 = fVar158;
  fStack_10d0 = fVar159;
  fStack_10cc = fVar160;
LAB_002ac870:
  lVar4 = 0;
  if (uVar27 != 0) {
    for (; (uVar27 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
    }
  }
  iVar21 = *(int *)(local_1158 + lVar4 * 4);
  local_11f8._0_4_ = -(uint)(iVar21 == local_1158._0_4_);
  local_11f8._4_4_ = -(uint)(iVar21 == local_1158._4_4_);
  local_11f8._8_4_ = -(uint)(iVar21 == local_1158._8_4_);
  local_11f8._12_4_ = -(uint)(iVar21 == local_1158._12_4_);
  auVar5._4_4_ = local_11f8._4_4_;
  auVar5._0_4_ = local_11f8._0_4_;
  auVar5._8_4_ = local_11f8._8_4_;
  auVar5._12_4_ = local_11f8._12_4_;
  uVar20 = movmskps((int)lVar4,auVar5);
  uVar22 = CONCAT44((int)((ulong)lVar4 >> 0x20),uVar20);
  uVar27 = ~uVar22 & uVar27;
  auVar38._4_4_ = local_11f8._4_4_;
  auVar38._0_4_ = local_11f8._0_4_;
  auVar38._8_4_ = local_11f8._8_4_;
  auVar38._12_4_ = local_11f8._12_4_;
  auVar15._4_4_ = fVar154;
  auVar15._0_4_ = fVar153;
  auVar15._8_4_ = fVar155;
  auVar15._12_4_ = fVar156;
  auVar78 = blendvps(_DAT_01feb9f0,auVar15,auVar38);
  auVar39._4_4_ = auVar78._0_4_;
  auVar39._0_4_ = auVar78._4_4_;
  auVar39._8_4_ = auVar78._12_4_;
  auVar39._12_4_ = auVar78._8_4_;
  auVar78 = minps(auVar39,auVar78);
  auVar134._0_8_ = auVar78._8_8_;
  auVar134._8_4_ = auVar78._0_4_;
  auVar134._12_4_ = auVar78._4_4_;
  auVar135 = minps(auVar134,auVar78);
  auVar40._4_4_ = local_11f8._4_4_;
  auVar40._0_4_ = local_11f8._0_4_;
  auVar40._8_4_ = local_11f8._8_4_;
  auVar40._12_4_ = local_11f8._12_4_;
  auVar17._4_4_ = fVar158;
  auVar17._0_4_ = fVar157;
  auVar17._8_4_ = fVar159;
  auVar17._12_4_ = fVar160;
  auVar78 = blendvps(_DAT_01feb9f0,auVar17,auVar40);
  auVar41._4_4_ = auVar78._0_4_;
  auVar41._0_4_ = auVar78._4_4_;
  auVar41._8_4_ = auVar78._12_4_;
  auVar41._12_4_ = auVar78._8_4_;
  auVar78 = minps(auVar41,auVar78);
  auVar79._0_8_ = auVar78._8_8_;
  auVar79._8_4_ = auVar78._0_4_;
  auVar79._12_4_ = auVar78._4_4_;
  auVar78 = minps(auVar79,auVar78);
  auVar135 = insertps(auVar135,auVar78,0x1c);
  auVar42._4_4_ = local_11f8._4_4_;
  auVar42._0_4_ = local_11f8._0_4_;
  auVar42._8_4_ = local_11f8._8_4_;
  auVar42._12_4_ = local_11f8._12_4_;
  auVar13._4_4_ = fVar111;
  auVar13._0_4_ = fVar105;
  auVar13._8_4_ = fVar113;
  auVar13._12_4_ = fVar115;
  auVar78 = blendvps(_DAT_01feb9f0,auVar13,auVar42);
  auVar43._4_4_ = auVar78._0_4_;
  auVar43._0_4_ = auVar78._4_4_;
  auVar43._8_4_ = auVar78._12_4_;
  auVar43._12_4_ = auVar78._8_4_;
  auVar78 = minps(auVar43,auVar78);
  auVar80._0_8_ = auVar78._8_8_;
  auVar80._8_4_ = auVar78._0_4_;
  auVar80._12_4_ = auVar78._4_4_;
  auVar78 = minps(auVar80,auVar78);
  auVar133 = insertps(auVar135,auVar78,0x20);
  auVar44._4_4_ = local_11f8._4_4_;
  auVar44._0_4_ = local_11f8._0_4_;
  auVar44._8_4_ = local_11f8._8_4_;
  auVar44._12_4_ = local_11f8._12_4_;
  auVar16._4_4_ = fVar154;
  auVar16._0_4_ = fVar153;
  auVar16._8_4_ = fVar155;
  auVar16._12_4_ = fVar156;
  auVar78 = blendvps(_DAT_01feba00,auVar16,auVar44);
  auVar45._4_4_ = auVar78._0_4_;
  auVar45._0_4_ = auVar78._4_4_;
  auVar45._8_4_ = auVar78._12_4_;
  auVar45._12_4_ = auVar78._8_4_;
  auVar78 = maxps(auVar45,auVar78);
  auVar81._0_8_ = auVar78._8_8_;
  auVar81._8_4_ = auVar78._0_4_;
  auVar81._12_4_ = auVar78._4_4_;
  auVar135 = maxps(auVar81,auVar78);
  auVar46._4_4_ = local_11f8._4_4_;
  auVar46._0_4_ = local_11f8._0_4_;
  auVar46._8_4_ = local_11f8._8_4_;
  auVar46._12_4_ = local_11f8._12_4_;
  auVar18._4_4_ = fVar158;
  auVar18._0_4_ = fVar157;
  auVar18._8_4_ = fVar159;
  auVar18._12_4_ = fVar160;
  auVar78 = blendvps(_DAT_01feba00,auVar18,auVar46);
  auVar47._4_4_ = auVar78._0_4_;
  auVar47._0_4_ = auVar78._4_4_;
  auVar47._8_4_ = auVar78._12_4_;
  auVar47._12_4_ = auVar78._8_4_;
  auVar78 = maxps(auVar47,auVar78);
  auVar82._0_8_ = auVar78._8_8_;
  auVar82._8_4_ = auVar78._0_4_;
  auVar82._12_4_ = auVar78._4_4_;
  auVar78 = maxps(auVar82,auVar78);
  auVar135 = insertps(auVar135,auVar78,0x1c);
  auVar48._4_4_ = local_11f8._4_4_;
  auVar48._0_4_ = local_11f8._0_4_;
  auVar48._8_4_ = local_11f8._8_4_;
  auVar48._12_4_ = local_11f8._12_4_;
  auVar14._4_4_ = fVar111;
  auVar14._0_4_ = fVar105;
  auVar14._8_4_ = fVar113;
  auVar14._12_4_ = fVar115;
  auVar78 = blendvps(_DAT_01feba00,auVar14,auVar48);
  auVar49._4_4_ = auVar78._0_4_;
  auVar49._0_4_ = auVar78._4_4_;
  auVar49._8_4_ = auVar78._12_4_;
  auVar49._12_4_ = auVar78._8_4_;
  auVar78 = maxps(auVar49,auVar78);
  auVar83._0_8_ = auVar78._8_8_;
  auVar83._8_4_ = auVar78._0_4_;
  auVar83._12_4_ = auVar78._4_4_;
  auVar78 = maxps(auVar83,auVar78);
  auVar129 = insertps(auVar135,auVar78,0x20);
  auVar50._4_4_ = -(uint)(0.0 <= auVar133._4_4_);
  auVar50._0_4_ = -(uint)(0.0 <= auVar133._0_4_);
  auVar50._8_4_ = -(uint)(0.0 <= auVar133._8_4_);
  auVar50._12_4_ = -(uint)(0.0 <= auVar133._12_4_);
  auVar78 = blendvps(auVar129,auVar133,auVar50);
  local_ff8 = auVar78._4_4_;
  uVar34 = (ulong)(local_ff8 < 0.0) << 4 | 0x20;
  fVar89 = auVar78._8_4_;
  stack[0].ptr.ptr = *(size_t *)&pAVar3[1].bounds.bounds0.lower.field_0;
  stack[0].mask = uVar22;
  uVar33 = (ulong)(fVar89 < 0.0) << 4 | 0x40;
  uVar35 = uVar34 ^ 0x10;
  local_fd8 = auVar78._0_4_;
  auVar51._4_4_ = local_11f8._4_4_;
  auVar51._0_4_ = local_11f8._0_4_;
  auVar51._8_4_ = local_11f8._8_4_;
  auVar51._12_4_ = local_11f8._12_4_;
  auVar7._4_4_ = fVar142;
  auVar7._0_4_ = fVar141;
  auVar7._8_4_ = fVar143;
  auVar7._12_4_ = fVar144;
  auVar78 = blendvps(_DAT_01feb9f0,auVar7,auVar51);
  auVar52._4_4_ = auVar78._0_4_;
  auVar52._0_4_ = auVar78._4_4_;
  auVar52._8_4_ = auVar78._12_4_;
  auVar52._12_4_ = auVar78._8_4_;
  auVar78 = minps(auVar52,auVar78);
  auVar84._0_8_ = auVar78._8_8_;
  auVar84._8_4_ = auVar78._0_4_;
  auVar84._12_4_ = auVar78._4_4_;
  auVar135 = minps(auVar84,auVar78);
  auVar53._4_4_ = local_11f8._4_4_;
  auVar53._0_4_ = local_11f8._0_4_;
  auVar53._8_4_ = local_11f8._8_4_;
  auVar53._12_4_ = local_11f8._12_4_;
  auVar9._4_4_ = fVar146;
  auVar9._0_4_ = fVar145;
  auVar9._8_4_ = fVar147;
  auVar9._12_4_ = fVar148;
  auVar78 = blendvps(_DAT_01feb9f0,auVar9,auVar53);
  auVar54._4_4_ = auVar78._0_4_;
  auVar54._0_4_ = auVar78._4_4_;
  auVar54._8_4_ = auVar78._12_4_;
  auVar54._12_4_ = auVar78._8_4_;
  auVar78 = minps(auVar54,auVar78);
  auVar108._0_8_ = auVar78._8_8_;
  auVar108._8_4_ = auVar78._0_4_;
  auVar108._12_4_ = auVar78._4_4_;
  auVar78 = minps(auVar108,auVar78);
  auVar55._4_4_ = local_11f8._4_4_;
  auVar55._0_4_ = local_11f8._0_4_;
  auVar55._8_4_ = local_11f8._8_4_;
  auVar55._12_4_ = local_11f8._12_4_;
  auVar11._4_4_ = fVar150;
  auVar11._0_4_ = fVar149;
  auVar11._8_4_ = fVar151;
  auVar11._12_4_ = fVar152;
  auVar119 = blendvps(_DAT_01feb9f0,auVar11,auVar55);
  auVar135 = insertps(auVar135,auVar78,0x1c);
  auVar56._4_4_ = auVar119._0_4_;
  auVar56._0_4_ = auVar119._4_4_;
  auVar56._8_4_ = auVar119._12_4_;
  auVar56._12_4_ = auVar119._8_4_;
  auVar78 = minps(auVar56,auVar119);
  auVar109._0_8_ = auVar78._8_8_;
  auVar109._8_4_ = auVar78._0_4_;
  auVar109._12_4_ = auVar78._4_4_;
  auVar78 = minps(auVar109,auVar78);
  auVar135 = insertps(auVar135,auVar78,0x20);
  auVar57._4_4_ = local_11f8._4_4_;
  auVar57._0_4_ = local_11f8._0_4_;
  auVar57._8_4_ = local_11f8._8_4_;
  auVar57._12_4_ = local_11f8._12_4_;
  auVar8._4_4_ = fVar142;
  auVar8._0_4_ = fVar141;
  auVar8._8_4_ = fVar143;
  auVar8._12_4_ = fVar144;
  auVar78 = blendvps(_DAT_01feba00,auVar8,auVar57);
  auVar58._4_4_ = auVar78._0_4_;
  auVar58._0_4_ = auVar78._4_4_;
  auVar58._8_4_ = auVar78._12_4_;
  auVar58._12_4_ = auVar78._8_4_;
  auVar78 = maxps(auVar58,auVar78);
  auVar110._0_8_ = auVar78._8_8_;
  auVar110._8_4_ = auVar78._0_4_;
  auVar110._12_4_ = auVar78._4_4_;
  auVar119 = maxps(auVar110,auVar78);
  auVar59._4_4_ = local_11f8._4_4_;
  auVar59._0_4_ = local_11f8._0_4_;
  auVar59._8_4_ = local_11f8._8_4_;
  auVar59._12_4_ = local_11f8._12_4_;
  auVar10._4_4_ = fVar146;
  auVar10._0_4_ = fVar145;
  auVar10._8_4_ = fVar147;
  auVar10._12_4_ = fVar148;
  auVar78 = blendvps(_DAT_01feba00,auVar10,auVar59);
  auVar60._4_4_ = auVar78._0_4_;
  auVar60._0_4_ = auVar78._4_4_;
  auVar60._8_4_ = auVar78._12_4_;
  auVar60._12_4_ = auVar78._8_4_;
  auVar78 = maxps(auVar60,auVar78);
  auVar120._0_8_ = auVar78._8_8_;
  auVar120._8_4_ = auVar78._0_4_;
  auVar120._12_4_ = auVar78._4_4_;
  auVar78 = maxps(auVar120,auVar78);
  auVar61._4_4_ = local_11f8._4_4_;
  auVar61._0_4_ = local_11f8._0_4_;
  auVar61._8_4_ = local_11f8._8_4_;
  auVar61._12_4_ = local_11f8._12_4_;
  auVar12._4_4_ = fVar150;
  auVar12._0_4_ = fVar149;
  auVar12._8_4_ = fVar151;
  auVar12._12_4_ = fVar152;
  auVar118 = blendvps(_DAT_01feba00,auVar12,auVar61);
  auVar119 = insertps(auVar119,auVar78,0x1c);
  auVar62._4_4_ = auVar118._0_4_;
  auVar62._0_4_ = auVar118._4_4_;
  auVar62._8_4_ = auVar118._12_4_;
  auVar62._12_4_ = auVar118._8_4_;
  auVar78 = maxps(auVar62,auVar118);
  auVar121._0_8_ = auVar78._8_8_;
  auVar121._8_4_ = auVar78._0_4_;
  auVar121._12_4_ = auVar78._4_4_;
  auVar78 = maxps(auVar121,auVar78);
  auVar78 = insertps(auVar119,auVar78,0x20);
  auVar118 = blendvps(auVar78,auVar135,auVar50);
  auVar78 = blendvps(auVar135,auVar78,auVar50);
  auVar63._4_4_ = local_11f8._4_4_;
  auVar63._0_4_ = local_11f8._0_4_;
  auVar63._8_4_ = local_11f8._8_4_;
  auVar63._12_4_ = local_11f8._12_4_;
  bi_9.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                 blendvps(_DAT_01feba00,local_10e8,auVar63);
  auVar122._4_4_ = bi_9.field_0._0_4_;
  auVar122._0_4_ = bi_9.field_0._4_4_;
  auVar122._8_4_ = bi_9.field_0._12_4_;
  auVar122._12_4_ = bi_9.field_0._8_4_;
  auVar119 = maxps(auVar122,(undefined1  [16])bi_9.field_0);
  auVar135 = blendvps(_DAT_01feb9f0,auVar37,auVar63);
  auVar138._4_4_ = auVar135._0_4_;
  auVar138._0_4_ = auVar135._4_4_;
  auVar138._8_4_ = auVar135._12_4_;
  auVar138._12_4_ = auVar135._8_4_;
  auVar139 = minps(auVar138,auVar135);
  auVar135 = blendvps(auVar133,auVar129,auVar50);
  local_fe8 = auVar78._0_4_ * local_fd8;
  local_1008 = auVar78._4_4_ * local_ff8;
  local_f98 = auVar78._8_4_ * fVar89;
  local_1018 = auVar135._0_4_;
  fVar127 = auVar118._0_4_ * local_1018;
  local_1038 = auVar135._4_4_;
  fVar130 = auVar118._4_4_ * local_1038;
  fVar137 = auVar135._8_4_;
  local_fa8 = auVar118._8_4_ * fVar137;
  uVar24 = (ulong)(local_fd8 < 0.0) * 0x10;
  fStack_fd4 = local_fd8;
  fStack_fd0 = local_fd8;
  fStack_fcc = local_fd8;
  fStack_fe4 = local_fe8;
  fStack_fe0 = local_fe8;
  fStack_fdc = local_fe8;
  fStack_ff4 = local_ff8;
  fStack_ff0 = local_ff8;
  fStack_fec = local_ff8;
  fStack_1004 = local_1008;
  fStack_1000 = local_1008;
  fStack_ffc = local_1008;
  fStack_f94 = local_f98;
  fStack_f90 = local_f98;
  fStack_f8c = local_f98;
  fStack_1014 = local_1018;
  fStack_1010 = local_1018;
  fStack_100c = local_1018;
  auVar64._4_4_ = local_11f8._4_4_;
  auVar64._0_4_ = local_11f8._0_4_;
  auVar64._8_4_ = local_11f8._8_4_;
  auVar64._12_4_ = local_11f8._12_4_;
  auVar78 = blendvps(_DAT_01feb9f0,auVar37,auVar64);
  local_1028._4_4_ = fVar127;
  local_1028._0_4_ = fVar127;
  fStack_1020 = fVar127;
  fStack_101c = fVar127;
  uVar20 = auVar139._0_4_;
  auVar140._8_4_ = auVar139._8_4_;
  auVar65._4_4_ = uVar20;
  auVar65._0_4_ = uVar20;
  auVar65._8_4_ = uVar20;
  auVar65._12_4_ = uVar20;
  auVar140._4_4_ = auVar140._8_4_;
  auVar140._0_4_ = auVar140._8_4_;
  auVar140._12_4_ = auVar140._8_4_;
  local_fc8 = minps(auVar140,auVar65);
  uVar20 = auVar119._0_4_;
  auVar123._8_4_ = auVar119._8_4_;
  auVar66._4_4_ = uVar20;
  auVar66._0_4_ = uVar20;
  auVar66._8_4_ = uVar20;
  auVar66._12_4_ = uVar20;
  auVar123._4_4_ = auVar123._8_4_;
  auVar123._0_4_ = auVar123._8_4_;
  auVar123._12_4_ = auVar123._8_4_;
  local_fb8 = maxps(auVar123,auVar66);
  fStack_1034 = local_1038;
  fStack_1030 = local_1038;
  fStack_102c = local_1038;
  local_1048._4_4_ = fVar130;
  local_1048._0_4_ = fVar130;
  fStack_1040 = fVar130;
  fStack_103c = fVar130;
  fStack_fa4 = local_fa8;
  fStack_fa0 = local_fa8;
  fStack_f9c = local_fa8;
  pSVar26 = stack + 1;
  uVar28 = uVar27;
LAB_002acc5f:
  if (pSVar26 != stack) {
    pSVar25 = pSVar26 + -1;
    uVar20 = movmskps((int)uVar22,local_1078);
    uVar22 = ~CONCAT44((int)(uVar22 >> 0x20),uVar20) & pSVar26[-1].mask;
    if (uVar22 != 0) {
      sVar32 = (pSVar25->ptr).ptr;
      do {
        if ((sVar32 & 8) != 0) {
          if (uVar22 != 0) {
            uVar31 = (ulong)((uint)sVar32 & 0xf) - 8;
            uVar22 = uVar31;
            auVar135 = local_1078;
            if (uVar31 == 0) goto LAB_002ad024;
            auVar6._8_4_ = 0xffffffff;
            auVar6._0_8_ = 0xffffffffffffffff;
            auVar6._12_4_ = 0xffffffff;
            local_1058 = local_1078 ^ auVar6;
            uVar28 = 1;
            goto LAB_002acead;
          }
          break;
        }
        pfVar2 = (float *)(sVar32 + 0x20 + uVar24);
        fVar127 = *pfVar2 * local_fd8 - local_fe8;
        fVar130 = pfVar2[1] * fStack_fd4 - fStack_fe4;
        fVar71 = pfVar2[2] * fStack_fd0 - fStack_fe0;
        fVar73 = pfVar2[3] * fStack_fcc - fStack_fdc;
        pfVar2 = (float *)(sVar32 + 0x20 + uVar34);
        fVar75 = *pfVar2 * local_ff8 - local_1008;
        fVar86 = pfVar2[1] * fStack_ff4 - fStack_1004;
        fVar90 = pfVar2[2] * fStack_ff0 - fStack_1000;
        fVar93 = pfVar2[3] * fStack_fec - fStack_ffc;
        uVar76 = (uint)((int)fVar75 < (int)fVar127) * (int)fVar127 |
                 (uint)((int)fVar75 >= (int)fVar127) * (int)fVar75;
        uVar87 = (uint)((int)fVar86 < (int)fVar130) * (int)fVar130 |
                 (uint)((int)fVar86 >= (int)fVar130) * (int)fVar86;
        uVar91 = (uint)((int)fVar90 < (int)fVar71) * (int)fVar71 |
                 (uint)((int)fVar90 >= (int)fVar71) * (int)fVar90;
        uVar94 = (uint)((int)fVar93 < (int)fVar73) * (int)fVar73 |
                 (uint)((int)fVar93 >= (int)fVar73) * (int)fVar93;
        pfVar2 = (float *)(sVar32 + 0x20 + uVar33);
        fVar127 = *pfVar2 * fVar89 - local_f98;
        fVar130 = pfVar2[1] * fVar89 - fStack_f94;
        fVar71 = pfVar2[2] * fVar89 - fStack_f90;
        fVar73 = pfVar2[3] * fVar89 - fStack_f8c;
        uVar19 = (uint)((int)fVar127 < (int)local_fc8._0_4_) * local_fc8._0_4_ |
                 (uint)((int)fVar127 >= (int)local_fc8._0_4_) * (int)fVar127;
        uVar70 = (uint)((int)fVar130 < (int)local_fc8._4_4_) * local_fc8._4_4_ |
                 (uint)((int)fVar130 >= (int)local_fc8._4_4_) * (int)fVar130;
        uVar72 = (uint)((int)fVar71 < (int)local_fc8._8_4_) * local_fc8._8_4_ |
                 (uint)((int)fVar71 >= (int)local_fc8._8_4_) * (int)fVar71;
        uVar74 = (uint)((int)fVar73 < (int)local_fc8._12_4_) * local_fc8._12_4_ |
                 (uint)((int)fVar73 >= (int)local_fc8._12_4_) * (int)fVar73;
        pfVar2 = (float *)(sVar32 + 0x20 + (uVar24 ^ 0x10));
        fVar127 = *pfVar2 * local_1018 - (float)local_1028._0_4_;
        fVar130 = pfVar2[1] * fStack_1014 - (float)local_1028._4_4_;
        fVar71 = pfVar2[2] * fStack_1010 - fStack_1020;
        fVar73 = pfVar2[3] * fStack_100c - fStack_101c;
        pfVar2 = (float *)(sVar32 + 0x20 + uVar35);
        fVar75 = *pfVar2 * local_1038 - (float)local_1048._0_4_;
        fVar86 = pfVar2[1] * fStack_1034 - (float)local_1048._4_4_;
        fVar90 = pfVar2[2] * fStack_1030 - fStack_1040;
        fVar93 = pfVar2[3] * fStack_102c - fStack_103c;
        uVar97 = (uint)((int)fVar127 < (int)fVar75) * (int)fVar127 |
                 (uint)((int)fVar127 >= (int)fVar75) * (int)fVar75;
        uVar99 = (uint)((int)fVar130 < (int)fVar86) * (int)fVar130 |
                 (uint)((int)fVar130 >= (int)fVar86) * (int)fVar86;
        uVar101 = (uint)((int)fVar71 < (int)fVar90) * (int)fVar71 |
                  (uint)((int)fVar71 >= (int)fVar90) * (int)fVar90;
        uVar103 = (uint)((int)fVar73 < (int)fVar93) * (int)fVar73 |
                  (uint)((int)fVar73 >= (int)fVar93) * (int)fVar93;
        pfVar2 = (float *)(sVar32 + 0x20 + (uVar33 ^ 0x10));
        fVar127 = *pfVar2 * fVar137 - local_fa8;
        fVar130 = pfVar2[1] * fVar137 - fStack_fa4;
        fVar71 = pfVar2[2] * fVar137 - fStack_fa0;
        fVar73 = pfVar2[3] * fVar137 - fStack_f9c;
        uVar77 = (uint)((int)local_fb8._0_4_ < (int)fVar127) * local_fb8._0_4_ |
                 (uint)((int)local_fb8._0_4_ >= (int)fVar127) * (int)fVar127;
        uVar88 = (uint)((int)local_fb8._4_4_ < (int)fVar130) * local_fb8._4_4_ |
                 (uint)((int)local_fb8._4_4_ >= (int)fVar130) * (int)fVar130;
        uVar92 = (uint)((int)local_fb8._8_4_ < (int)fVar71) * local_fb8._8_4_ |
                 (uint)((int)local_fb8._8_4_ >= (int)fVar71) * (int)fVar71;
        uVar95 = (uint)((int)local_fb8._12_4_ < (int)fVar73) * local_fb8._12_4_ |
                 (uint)((int)local_fb8._12_4_ >= (int)fVar73) * (int)fVar73;
        auVar67._4_4_ =
             -(uint)((float)(((int)uVar70 < (int)uVar87) * uVar87 |
                            ((int)uVar70 >= (int)uVar87) * uVar70) <=
                    (float)(((int)uVar99 < (int)uVar88) * uVar99 |
                           ((int)uVar99 >= (int)uVar88) * uVar88));
        auVar67._0_4_ =
             -(uint)((float)(((int)uVar19 < (int)uVar76) * uVar76 |
                            ((int)uVar19 >= (int)uVar76) * uVar19) <=
                    (float)(((int)uVar97 < (int)uVar77) * uVar97 |
                           ((int)uVar97 >= (int)uVar77) * uVar77));
        auVar67._8_4_ =
             -(uint)((float)(((int)uVar72 < (int)uVar91) * uVar91 |
                            ((int)uVar72 >= (int)uVar91) * uVar72) <=
                    (float)(((int)uVar101 < (int)uVar92) * uVar101 |
                           ((int)uVar101 >= (int)uVar92) * uVar92));
        auVar67._12_4_ =
             -(uint)((float)(((int)uVar74 < (int)uVar94) * uVar94 |
                            ((int)uVar74 >= (int)uVar94) * uVar74) <=
                    (float)(((int)uVar103 < (int)uVar95) * uVar103 |
                           ((int)uVar103 >= (int)uVar95) * uVar95));
        uVar19 = movmskps((int)uVar35,auVar67);
        if (uVar19 == 0) {
          pSVar26 = (StackItemMaskT<embree::NodeRefPtr<4>_> *)0x0;
        }
        else {
          uVar31 = (ulong)(uVar19 & 0xff);
          uVar22 = 0;
          sVar29 = 8;
          do {
            lVar4 = 0;
            if (uVar31 != 0) {
              for (; (uVar31 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
              }
            }
            fVar127 = *(float *)(sVar32 + 0x20 + lVar4 * 4);
            fVar130 = *(float *)(sVar32 + 0x30 + lVar4 * 4);
            fVar71 = *(float *)(sVar32 + 0x40 + lVar4 * 4);
            fVar73 = *(float *)(sVar32 + 0x50 + lVar4 * 4);
            fVar98 = (fVar127 - fVar141) * fVar153;
            fVar100 = (fVar127 - fVar142) * fVar154;
            fVar102 = (fVar127 - fVar143) * fVar155;
            fVar104 = (fVar127 - fVar144) * fVar156;
            fVar106 = (fVar71 - fVar145) * fVar157;
            fVar112 = (fVar71 - fVar146) * fVar158;
            fVar114 = (fVar71 - fVar147) * fVar159;
            fVar116 = (fVar71 - fVar148) * fVar160;
            fVar127 = *(float *)(sVar32 + 0x60 + lVar4 * 4);
            fVar117 = (fVar127 - fVar149) * fVar105;
            fVar124 = (fVar127 - fVar150) * fVar111;
            fVar125 = (fVar127 - fVar151) * fVar113;
            fVar126 = (fVar127 - fVar152) * fVar115;
            fVar86 = (fVar130 - fVar141) * fVar153;
            fVar90 = (fVar130 - fVar142) * fVar154;
            fVar93 = (fVar130 - fVar143) * fVar155;
            fVar96 = (fVar130 - fVar144) * fVar156;
            fVar130 = (fVar73 - fVar145) * fVar157;
            fVar71 = (fVar73 - fVar146) * fVar158;
            fVar75 = (fVar73 - fVar147) * fVar159;
            fVar73 = (fVar73 - fVar148) * fVar160;
            fVar127 = *(float *)(sVar32 + 0x70 + lVar4 * 4);
            fVar128 = (fVar127 - fVar149) * fVar105;
            fVar131 = (fVar127 - fVar150) * fVar111;
            fVar132 = (fVar127 - fVar151) * fVar113;
            fVar127 = (fVar127 - fVar152) * fVar115;
            uVar19 = (uint)((int)fVar86 < (int)fVar98) * (int)fVar86 |
                     (uint)((int)fVar86 >= (int)fVar98) * (int)fVar98;
            uVar70 = (uint)((int)fVar90 < (int)fVar100) * (int)fVar90 |
                     (uint)((int)fVar90 >= (int)fVar100) * (int)fVar100;
            uVar72 = (uint)((int)fVar93 < (int)fVar102) * (int)fVar93 |
                     (uint)((int)fVar93 >= (int)fVar102) * (int)fVar102;
            uVar74 = (uint)((int)fVar96 < (int)fVar104) * (int)fVar96 |
                     (uint)((int)fVar96 >= (int)fVar104) * (int)fVar104;
            uVar76 = (uint)((int)fVar130 < (int)fVar106) * (int)fVar130 |
                     (uint)((int)fVar130 >= (int)fVar106) * (int)fVar106;
            uVar77 = (uint)((int)fVar71 < (int)fVar112) * (int)fVar71 |
                     (uint)((int)fVar71 >= (int)fVar112) * (int)fVar112;
            uVar87 = (uint)((int)fVar75 < (int)fVar114) * (int)fVar75 |
                     (uint)((int)fVar75 >= (int)fVar114) * (int)fVar114;
            uVar88 = (uint)((int)fVar73 < (int)fVar116) * (int)fVar73 |
                     (uint)((int)fVar73 >= (int)fVar116) * (int)fVar116;
            uVar97 = ((int)uVar76 < (int)uVar19) * uVar19 | ((int)uVar76 >= (int)uVar19) * uVar76;
            uVar99 = ((int)uVar77 < (int)uVar70) * uVar70 | ((int)uVar77 >= (int)uVar70) * uVar77;
            uVar101 = ((int)uVar87 < (int)uVar72) * uVar72 | ((int)uVar87 >= (int)uVar72) * uVar87;
            uVar103 = ((int)uVar88 < (int)uVar74) * uVar74 | ((int)uVar88 >= (int)uVar74) * uVar88;
            uVar19 = (uint)((int)fVar128 < (int)fVar117) * (int)fVar128 |
                     (uint)((int)fVar128 >= (int)fVar117) * (int)fVar117;
            uVar70 = (uint)((int)fVar131 < (int)fVar124) * (int)fVar131 |
                     (uint)((int)fVar131 >= (int)fVar124) * (int)fVar124;
            uVar72 = (uint)((int)fVar132 < (int)fVar125) * (int)fVar132 |
                     (uint)((int)fVar132 >= (int)fVar125) * (int)fVar125;
            uVar74 = (uint)((int)fVar127 < (int)fVar126) * (int)fVar127 |
                     (uint)((int)fVar127 >= (int)fVar126) * (int)fVar126;
            local_11c8 = auVar78._0_4_;
            iStack_11c4 = auVar78._4_4_;
            iStack_11c0 = auVar78._8_4_;
            iStack_11bc = auVar78._12_4_;
            uVar91 = (uint)((int)uVar19 < local_11c8) * local_11c8 |
                     ((int)uVar19 >= local_11c8) * uVar19;
            uVar92 = (uint)((int)uVar70 < iStack_11c4) * iStack_11c4 |
                     ((int)uVar70 >= iStack_11c4) * uVar70;
            uVar94 = (uint)((int)uVar72 < iStack_11c0) * iStack_11c0 |
                     ((int)uVar72 >= iStack_11c0) * uVar72;
            uVar95 = (uint)((int)uVar74 < iStack_11bc) * iStack_11bc |
                     ((int)uVar74 >= iStack_11bc) * uVar74;
            uVar76 = (uint)((int)fVar86 < (int)fVar98) * (int)fVar98 |
                     (uint)((int)fVar86 >= (int)fVar98) * (int)fVar86;
            uVar77 = (uint)((int)fVar90 < (int)fVar100) * (int)fVar100 |
                     (uint)((int)fVar90 >= (int)fVar100) * (int)fVar90;
            uVar87 = (uint)((int)fVar93 < (int)fVar102) * (int)fVar102 |
                     (uint)((int)fVar93 >= (int)fVar102) * (int)fVar93;
            uVar88 = (uint)((int)fVar96 < (int)fVar104) * (int)fVar104 |
                     (uint)((int)fVar96 >= (int)fVar104) * (int)fVar96;
            uVar19 = (uint)((int)fVar130 < (int)fVar106) * (int)fVar106 |
                     (uint)((int)fVar130 >= (int)fVar106) * (int)fVar130;
            uVar70 = (uint)((int)fVar71 < (int)fVar112) * (int)fVar112 |
                     (uint)((int)fVar71 >= (int)fVar112) * (int)fVar71;
            uVar72 = (uint)((int)fVar75 < (int)fVar114) * (int)fVar114 |
                     (uint)((int)fVar75 >= (int)fVar114) * (int)fVar75;
            uVar74 = (uint)((int)fVar73 < (int)fVar116) * (int)fVar116 |
                     (uint)((int)fVar73 >= (int)fVar116) * (int)fVar73;
            uVar19 = ((int)uVar76 < (int)uVar19) * uVar76 | ((int)uVar76 >= (int)uVar19) * uVar19;
            uVar70 = ((int)uVar77 < (int)uVar70) * uVar77 | ((int)uVar77 >= (int)uVar70) * uVar70;
            uVar72 = ((int)uVar87 < (int)uVar72) * uVar87 | ((int)uVar87 >= (int)uVar72) * uVar72;
            uVar74 = ((int)uVar88 < (int)uVar74) * uVar88 | ((int)uVar88 >= (int)uVar74) * uVar74;
            uVar76 = (uint)((int)fVar128 < (int)fVar117) * (int)fVar117 |
                     (uint)((int)fVar128 >= (int)fVar117) * (int)fVar128;
            uVar77 = (uint)((int)fVar131 < (int)fVar124) * (int)fVar124 |
                     (uint)((int)fVar131 >= (int)fVar124) * (int)fVar131;
            uVar87 = (uint)((int)fVar132 < (int)fVar125) * (int)fVar125 |
                     (uint)((int)fVar132 >= (int)fVar125) * (int)fVar132;
            uVar88 = (uint)((int)fVar127 < (int)fVar126) * (int)fVar126 |
                     (uint)((int)fVar127 >= (int)fVar126) * (int)fVar127;
            uVar76 = (uint)(bi_9.field_0.i[0] < (int)uVar76) * bi_9.field_0.i[0] |
                     (bi_9.field_0.i[0] >= (int)uVar76) * uVar76;
            uVar77 = (uint)(bi_9.field_0.i[1] < (int)uVar77) * bi_9.field_0.i[1] |
                     (bi_9.field_0.i[1] >= (int)uVar77) * uVar77;
            uVar87 = (uint)(bi_9.field_0.i[2] < (int)uVar87) * bi_9.field_0.i[2] |
                     (bi_9.field_0.i[2] >= (int)uVar87) * uVar87;
            uVar88 = (uint)(bi_9.field_0.i[3] < (int)uVar88) * bi_9.field_0.i[3] |
                     (bi_9.field_0.i[3] >= (int)uVar88) * uVar88;
            auVar136._4_4_ =
                 -(uint)((float)(((int)uVar92 < (int)uVar99) * uVar99 |
                                ((int)uVar92 >= (int)uVar99) * uVar92) <=
                        (float)(((int)uVar70 < (int)uVar77) * uVar70 |
                               ((int)uVar70 >= (int)uVar77) * uVar77));
            auVar136._0_4_ =
                 -(uint)((float)(((int)uVar91 < (int)uVar97) * uVar97 |
                                ((int)uVar91 >= (int)uVar97) * uVar91) <=
                        (float)(((int)uVar19 < (int)uVar76) * uVar19 |
                               ((int)uVar19 >= (int)uVar76) * uVar76));
            auVar136._8_4_ =
                 -(uint)((float)(((int)uVar94 < (int)uVar101) * uVar101 |
                                ((int)uVar94 >= (int)uVar101) * uVar94) <=
                        (float)(((int)uVar72 < (int)uVar87) * uVar72 |
                               ((int)uVar72 >= (int)uVar87) * uVar87));
            auVar136._12_4_ =
                 -(uint)((float)(((int)uVar95 < (int)uVar103) * uVar103 |
                                ((int)uVar95 >= (int)uVar103) * uVar95) <=
                        (float)(((int)uVar74 < (int)uVar88) * uVar74 |
                               ((int)uVar74 >= (int)uVar88) * uVar88));
            uVar19 = movmskps((int)uVar28,auVar136);
            uVar28 = (ulong)uVar19;
            sVar30 = sVar29;
            if (uVar19 != 0) {
              sVar30 = *(size_t *)(sVar32 + lVar4 * 8);
              if (sVar29 != 8) {
                (pSVar25->ptr).ptr = sVar29;
                pSVar25->mask = uVar22;
                pSVar25 = pSVar25 + 1;
              }
              uVar22 = uVar28 & 0xff;
            }
            uVar1 = uVar31 - 1;
            uVar31 = uVar31 & uVar1;
            sVar29 = sVar30;
          } while (uVar31 != 0);
          pSVar26 = (StackItemMaskT<embree::NodeRefPtr<4>_> *)
                    CONCAT71((int7)(uVar1 >> 8),sVar30 != 8);
          sVar32 = sVar30;
        }
      } while ((char)pSVar26 != '\0');
    }
    uVar22 = 0;
    goto LAB_002ad058;
  }
  goto LAB_002ad069;
  while( true ) {
    uVar22 = uVar28 + 1;
    local_1058._4_4_ = uVar70;
    local_1058._0_4_ = uVar19;
    local_1058._8_4_ = auVar68._8_4_;
    local_1058._12_4_ = auVar68._12_4_;
    bVar36 = uVar31 <= uVar28;
    uVar28 = uVar22;
    if (bVar36) break;
LAB_002acead:
    local_1140.geomID = *(uint *)(((sVar32 & 0xfffffffffffffff0) - 8) + uVar28 * 8);
    local_1110 = (context->scene->geometries).items[local_1140.geomID].ptr;
    uVar19 = local_1110->mask;
    auVar85._0_4_ = -(uint)((uVar19 & *(uint *)(ray + 0x90)) == 0);
    auVar85._4_4_ = -(uint)((uVar19 & *(uint *)(ray + 0x94)) == 0);
    auVar85._8_4_ = -(uint)((uVar19 & *(uint *)(ray + 0x98)) == 0);
    auVar85._12_4_ = -(uint)((uVar19 & *(uint *)(ray + 0x9c)) == 0);
    mask.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)(~auVar85 & local_1058);
    uVar76 = movmskps((int)pSVar26,(undefined1  [16])mask.field_0);
    pSVar26 = (StackItemMaskT<embree::NodeRefPtr<4>_> *)(ulong)uVar76;
    uVar19 = local_1068;
    uVar70 = uStack_1064;
    uVar72 = uStack_1060;
    uVar74 = uStack_105c;
    if (uVar76 != 0) {
      local_1140.primID = *(uint *)(((sVar32 & 0xfffffffffffffff0) - 4) + uVar28 * 8);
      local_1140.valid = (int *)&mask;
      local_1140.geometryUserPtr = local_1110->userPtr;
      pSVar26 = (StackItemMaskT<embree::NodeRefPtr<4>_> *)context->user;
      local_1140.N = 4;
      local_1108 = 0;
      local_1100 = context->args;
      p_Var23 = local_1100->intersect;
      if (p_Var23 == (RTCIntersectFunctionN)0x0) {
        p_Var23 = (RTCIntersectFunctionN)
                  local_1110[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      }
      local_1140.context = (RTCRayQueryContext *)pSVar26;
      local_1140.rayhit = (RTCRayHitN *)ray;
      local_1110 = (Geometry *)(*p_Var23)(&local_1140);
      uVar19 = -(uint)(*(float *)(ray + 0x80) < 0.0);
      uVar70 = -(uint)(*(float *)(ray + 0x84) < 0.0);
      uVar72 = -(uint)(*(float *)(ray + 0x88) < 0.0);
      uVar74 = -(uint)(*(float *)(ray + 0x8c) < 0.0);
      auVar135 = local_1078;
      fVar141 = local_1088;
      fVar142 = fStack_1084;
      fVar143 = fStack_1080;
      fVar144 = fStack_107c;
      fVar145 = local_1098;
      fVar146 = fStack_1094;
      fVar147 = fStack_1090;
      fVar148 = fStack_108c;
      fVar149 = local_10a8;
      fVar150 = fStack_10a4;
      fVar151 = fStack_10a0;
      fVar152 = fStack_109c;
      fVar105 = local_10b8;
      fVar111 = fStack_10b4;
      fVar113 = fStack_10b0;
      fVar115 = fStack_10ac;
      fVar153 = local_10c8;
      fVar154 = fStack_10c4;
      fVar155 = fStack_10c0;
      fVar156 = fStack_10bc;
      fVar157 = local_10d8;
      fVar158 = fStack_10d4;
      fVar159 = fStack_10d0;
      fVar160 = fStack_10cc;
    }
    uVar19 = ~uVar19 & local_1058._0_4_;
    uVar70 = ~uVar70 & local_1058._4_4_;
    auVar68._0_8_ = CONCAT44(uVar70,uVar19);
    auVar68._8_4_ = ~uVar72 & local_1058._8_4_;
    auVar68._12_4_ = ~uVar74 & local_1058._12_4_;
    iVar21 = movmskps((int)local_1110,auVar68);
    uVar22 = CONCAT44((int)((ulong)local_1110 >> 0x20),iVar21);
    if (iVar21 == 0) break;
  }
  local_1078._0_8_ = auVar68._0_8_ ^ 0xffffffffffffffff;
  local_1078._8_4_ = auVar68._8_4_ ^ 0xffffffff;
  local_1078._12_4_ = auVar68._12_4_ ^ 0xffffffff;
LAB_002ad024:
  local_1078 = auVar135 | local_1078;
  local_11f8._0_4_ = ~local_1078._0_4_ & local_11f8._0_4_;
  local_11f8._4_4_ = ~local_1078._4_4_ & local_11f8._4_4_;
  local_11f8._8_4_ = ~local_1078._8_4_ & local_11f8._8_4_;
  local_11f8._12_4_ = ~local_1078._12_4_ & local_11f8._12_4_;
  iVar21 = movmskps((int)uVar22,local_11f8);
  if (iVar21 == 0) {
    uVar22 = CONCAT71((int7)(CONCAT44((int)(uVar22 >> 0x20),iVar21) >> 8),1);
  }
  else {
    bi_9.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                   blendvps((undefined1  [16])bi_9.field_0,_DAT_01feba00,local_1078);
    uVar22 = 0;
  }
LAB_002ad058:
  pSVar26 = pSVar25;
  if ((char)uVar22 != '\0') goto LAB_002ad069;
  goto LAB_002acc5f;
LAB_002ad069:
  if (uVar27 == 0) {
    auVar69._0_4_ = -(uint)(local_10f8 == -1);
    auVar69._4_4_ = -(uint)(iStack_10f4 == -1);
    auVar69._8_4_ = -(uint)(iStack_10f0 == -1);
    auVar69._12_4_ = -(uint)(iStack_10ec == -1);
    auVar78 = blendvps(*(undefined1 (*) [16])(ray + 0x80),_DAT_01feba00,auVar69 & local_1078);
    *(undefined1 (*) [16])(ray + 0x80) = auVar78;
    return;
  }
  goto LAB_002ac870;
}

Assistant:

__forceinline vboolf4 operator ==(const vint4& a, const vint4& b) { return _mm_castsi128_ps(_mm_cmpeq_epi32(a, b)); }